

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetIntegerVerifier::verifyFloatExpanded
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  ostringstream *this_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  StateQueryMemoryWriteGuard<int> state;
  Hex<8UL> local_1b8;
  StateQueryMemoryWriteGuard<int> local_1b0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  lVar2 = (long)((reference * 4.2949673e+09 + -1.0) * 0.5);
  uVar4 = lVar2 + 0x3ff;
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0x7fffffff;
  }
  if ((long)uVar4 < -0x7fffffff) {
    uVar4 = 0xffffffff80000000;
  }
  uVar3 = lVar2 - 0x3ff;
  if (0x7ffffffe < (long)uVar3) {
    uVar3 = 0x7fffffff;
  }
  if ((long)uVar3 < -0x7fffffff) {
    uVar3 = 0xffffffff80000000;
  }
  local_1b0.m_preguard = -0x21212122;
  local_1b0.m_value = -0x21212122;
  local_1b0.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1b0.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1b0,testCtx);
  if ((bVar1) && ((int)uVar4 < local_1b0.m_value || local_1b0.m_value < (int)uVar3)) {
    local_1a0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected in range [",0x1d);
    local_1b8.value = uVar3 & 0xffffffff;
    tcu::Format::Hex<8UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
    local_1b8.value = uVar4 & 0xffffffff;
    tcu::Format::Hex<8UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]; got ",7);
    local_1b8.value = (ulong)local_1b0._0_8_ >> 0x20;
    tcu::Format::Hex<8UL>::toStream(&local_1b8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyFloatExpanded (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	DE_ASSERT(de::inRange(reference, -1.0f, 1.0f));

	using tcu::TestLog;
	using tcu::toHex;

	const GLint expectedGLStateMax = clampToGLint(expandGLFloatToInteger(reference) + FLOAT_EXPANSION_E);
	const GLint expectedGLStateMin = clampToGLint(expandGLFloatToInteger(reference) - FLOAT_EXPANSION_E);

	StateQueryMemoryWriteGuard<GLint> state;
	glGetIntegerv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected in range [" << toHex(expectedGLStateMin) << "," << toHex(expectedGLStateMax) << "]; got " << toHex((GLint)state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}